

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::SegmentInfo::SegmentInfo(SegmentInfo *this)

{
  this->duration_ = -1.0;
  this->muxing_app_ = (char *)0x0;
  this->timecode_scale_ = 1000000;
  this->writing_app_ = (char *)0x0;
  this->date_utc_ = -0x8000000000000000;
  this->duration_pos_ = -1;
  return;
}

Assistant:

SegmentInfo::SegmentInfo()
    : duration_(-1.0),
      muxing_app_(NULL),
      timecode_scale_(1000000ULL),
      writing_app_(NULL),
      date_utc_(LLONG_MIN),
      duration_pos_(-1) {}